

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disp.hpp
# Opt level: O1

void __thiscall
so_5::disp::thread_pool::impl::work_thread_details::
work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>
::do_queue_processing
          (work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>
           *this,agent_queue_t *current_queue)

{
  iterator *piVar1;
  dispatcher_queue_t *pdVar2;
  __uniq_ptr_impl<so_5::disp::mpmc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpmc_queue_traits::lock_t>_>
  _Var3;
  _Elt_pointer ppaVar4;
  emptyness_t eVar5;
  agent_queue_t *in_RAX;
  agent_queue_t *local_38;
  
  local_38 = in_RAX;
  do {
    eVar5 = process_queue(this,current_queue);
    if (eVar5 == not_empty) {
      pdVar2 = (this->super_with_activity_tracking_impl_t).super_common_data_t.m_disp_queue;
      _Var3._M_t.
      super__Tuple_impl<0UL,_so_5::disp::mpmc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpmc_queue_traits::lock_t>_>
      .super__Head_base<0UL,_so_5::disp::mpmc_queue_traits::lock_t_*,_false>._M_head_impl =
           (pdVar2->m_lock)._M_t.
           super___uniq_ptr_impl<so_5::disp::mpmc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpmc_queue_traits::lock_t>_>
           ._M_t;
      local_38 = current_queue;
      (**(code **)(*(long *)_Var3._M_t.
                            super__Tuple_impl<0UL,_so_5::disp::mpmc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpmc_queue_traits::lock_t>_>
                            .super__Head_base<0UL,_so_5::disp::mpmc_queue_traits::lock_t_*,_false>.
                            _M_head_impl + 0x10))
                (_Var3._M_t.
                 super__Tuple_impl<0UL,_so_5::disp::mpmc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpmc_queue_traits::lock_t>_>
                 .super__Head_base<0UL,_so_5::disp::mpmc_queue_traits::lock_t_*,_false>._M_head_impl
                );
      if (pdVar2->m_shutdown == false) {
        ppaVar4 = ((iterator *)
                  ((long)&(pdVar2->m_queue).
                          super__Deque_base<so_5::disp::thread_pool::impl::agent_queue_t_*,_std::allocator<so_5::disp::thread_pool::impl::agent_queue_t_*>_>
                          ._M_impl.super__Deque_impl_data + 0x10))->_M_cur;
        current_queue = local_38;
        if (((iterator *)
            ((long)&(pdVar2->m_queue).
                    super__Deque_base<so_5::disp::thread_pool::impl::agent_queue_t_*,_std::allocator<so_5::disp::thread_pool::impl::agent_queue_t_*>_>
                    ._M_impl.super__Deque_impl_data + 0x30))->_M_cur != ppaVar4) {
          current_queue = *ppaVar4;
          std::
          deque<so_5::disp::thread_pool::impl::agent_queue_t_*,_std::allocator<so_5::disp::thread_pool::impl::agent_queue_t_*>_>
          ::pop_front(&pdVar2->m_queue);
          ppaVar4 = ((iterator *)
                    ((long)&(pdVar2->m_queue).
                            super__Deque_base<so_5::disp::thread_pool::impl::agent_queue_t_*,_std::allocator<so_5::disp::thread_pool::impl::agent_queue_t_*>_>
                            ._M_impl.super__Deque_impl_data + 0x30))->_M_cur;
          if (ppaVar4 ==
              *(_Elt_pointer *)
               ((long)&(pdVar2->m_queue).
                       super__Deque_base<so_5::disp::thread_pool::impl::agent_queue_t_*,_std::allocator<so_5::disp::thread_pool::impl::agent_queue_t_*>_>
                       ._M_impl.super__Deque_impl_data + 0x40) + -1) {
            std::
            deque<so_5::disp::thread_pool::impl::agent_queue_t*,std::allocator<so_5::disp::thread_pool::impl::agent_queue_t*>>
            ::_M_push_back_aux<so_5::disp::thread_pool::impl::agent_queue_t*const&>
                      ((deque<so_5::disp::thread_pool::impl::agent_queue_t*,std::allocator<so_5::disp::thread_pool::impl::agent_queue_t*>>
                        *)&pdVar2->m_queue,&local_38);
          }
          else {
            *ppaVar4 = local_38;
            piVar1 = (iterator *)
                     ((long)&(pdVar2->m_queue).
                             super__Deque_base<so_5::disp::thread_pool::impl::agent_queue_t_*,_std::allocator<so_5::disp::thread_pool::impl::agent_queue_t_*>_>
                             ._M_impl.super__Deque_impl_data + 0x30);
            piVar1->_M_cur = piVar1->_M_cur + 1;
          }
        }
      }
      else {
        current_queue = (agent_queue_t *)0x0;
      }
      (**(code **)(*(long *)_Var3._M_t.
                            super__Tuple_impl<0UL,_so_5::disp::mpmc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpmc_queue_traits::lock_t>_>
                            .super__Head_base<0UL,_so_5::disp::mpmc_queue_traits::lock_t_*,_false>.
                            _M_head_impl + 0x18))
                (_Var3._M_t.
                 super__Tuple_impl<0UL,_so_5::disp::mpmc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpmc_queue_traits::lock_t>_>
                 .super__Head_base<0UL,_so_5::disp::mpmc_queue_traits::lock_t_*,_false>._M_head_impl
                );
    }
    else {
      current_queue = (agent_queue_t *)0x0;
    }
  } while (current_queue != (agent_queue_t *)0x0);
  return;
}

Assistant:

void
		do_queue_processing( agent_queue_t * current_queue )
			{
				do
					{
						const auto e = this->process_queue( *current_queue );

						if( agent_queue_t::emptyness_t::not_empty == e )
							{
								// We can continue processing of that queue if
								// there is no more non-empty queues waiting.
								current_queue =
									this->m_disp_queue->try_switch_to_another(
										current_queue );
							}
						else
							// Handling of the current queue should be stopped.
							current_queue = nullptr;
					}
				while( current_queue != nullptr );
			}